

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.hpp
# Opt level: O2

void __thiscall String::String(String *this,usize capacity)

{
  Data *pDVar1;
  
  pDVar1 = (Data *)operator_new__(capacity + 0x21);
  this->data = pDVar1;
  pDVar1->str = (char *)(pDVar1 + 1);
  *(undefined1 *)&pDVar1[1].str = 0;
  pDVar1->len = 0;
  pDVar1->ref = 1;
  pDVar1->capacity = capacity;
  return;
}

Assistant:

explicit String(usize capacity)
  {
    data = (Data*)new char[(capacity + 1) * sizeof(char) + sizeof(Data)];
    data->str = (char*)((byte*)data + sizeof(Data));
    *((char*)data->str) = '\0';
    data->len = 0;
    data->ref = 1;
    data->capacity = capacity;
  }